

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferBase.cpp
# Opt level: O0

vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> * __thiscall
myvk::BufferBase::GetSrcMemoryBarriers
          (BufferBase *this,vector<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_> *regions,
          VkAccessFlags src_access_mask,VkAccessFlags dst_access_mask,uint32_t src_queue_family,
          uint32_t dst_queue_family)

{
  long lVar1;
  ulong uVar2;
  size_type sVar3;
  reference pvVar4;
  const_reference pvVar5;
  VkDeviceSize VVar6;
  VkAccessFlags in_ECX;
  vector<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_> *in_RDX;
  long in_RSI;
  vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *in_RDI;
  VkAccessFlags in_R8D;
  uint32_t in_R9D;
  uint32_t in_stack_00000008;
  VkBufferMemoryBarrier *cur;
  uint32_t i;
  vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *barriers;
  allocator_type *in_stack_ffffffffffffff80;
  size_type in_stack_ffffffffffffff88;
  vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *in_stack_ffffffffffffff90;
  uint local_38;
  allocator<VkBufferMemoryBarrier> local_26;
  undefined1 local_25;
  uint32_t local_24;
  VkAccessFlags local_20;
  VkAccessFlags local_1c;
  vector<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_> *local_18;
  
  local_25 = 0;
  local_24 = in_R9D;
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_18 = in_RDX;
  std::vector<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_>::size(in_RDX);
  std::allocator<VkBufferMemoryBarrier>::allocator((allocator<VkBufferMemoryBarrier> *)0x2a9b14);
  std::vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::vector
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  std::allocator<VkBufferMemoryBarrier>::~allocator(&local_26);
  local_38 = 0;
  while( true ) {
    uVar2 = (ulong)local_38;
    sVar3 = std::vector<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_>::size(local_18);
    if (sVar3 <= uVar2) break;
    pvVar4 = std::vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::operator[]
                       (in_RDI,(ulong)local_38);
    pvVar4->sType = VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER;
    uVar2 = (ulong)local_38;
    sVar3 = std::vector<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_>::size(local_18);
    if (uVar2 == sVar3 - 1) {
      lVar1 = *(long *)(in_RSI + 0x20);
      pvVar5 = std::vector<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_>::operator[]
                         (local_18,(ulong)local_38);
      VVar6 = lVar1 - pvVar5->bufferOffset;
    }
    else {
      pvVar5 = std::vector<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_>::operator[]
                         (local_18,(ulong)(local_38 + 1));
      VVar6 = pvVar5->bufferOffset;
      pvVar5 = std::vector<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_>::operator[]
                         (local_18,(ulong)local_38);
      VVar6 = VVar6 - pvVar5->bufferOffset;
    }
    pvVar4->size = VVar6;
    pvVar4->buffer = *(VkBuffer *)(in_RSI + 0x18);
    pvVar5 = std::vector<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_>::operator[]
                       (local_18,(ulong)local_38);
    pvVar4->offset = pvVar5->bufferOffset;
    pvVar4->srcAccessMask = local_1c;
    pvVar4->dstAccessMask = local_20;
    pvVar4->srcQueueFamilyIndex = local_24;
    pvVar4->dstQueueFamilyIndex = in_stack_00000008;
    local_38 = local_38 + 1;
  }
  return in_RDI;
}

Assistant:

std::vector<VkBufferMemoryBarrier> BufferBase::GetSrcMemoryBarriers(const std::vector<VkBufferImageCopy> &regions,
                                                                    VkAccessFlags src_access_mask,
                                                                    VkAccessFlags dst_access_mask,
                                                                    uint32_t src_queue_family,
                                                                    uint32_t dst_queue_family) const {
	std::vector<VkBufferMemoryBarrier> barriers(regions.size());
	for (uint32_t i = 0; i < regions.size(); i++) {
		VkBufferMemoryBarrier &cur = barriers[i];
		cur.sType = VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER;
		cur.size = (i == regions.size() - 1) ? m_size - regions[i].bufferOffset
		                                     : regions[i + 1].bufferOffset - regions[i].bufferOffset;

		cur.buffer = m_buffer;
		cur.offset = regions[i].bufferOffset;
		cur.srcAccessMask = src_access_mask;
		cur.dstAccessMask = dst_access_mask;

		cur.srcQueueFamilyIndex = src_queue_family;
		cur.dstQueueFamilyIndex = dst_queue_family;
	}
	return barriers;
}